

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderFailIfExtraTestissue164::~TestCharReaderFailIfExtraTestissue164
          (TestCharReaderFailIfExtraTestissue164 *this)

{
  void *in_RDI;
  
  ~TestCharReaderFailIfExtraTestissue164((TestCharReaderFailIfExtraTestissue164 *)0x16bf58);
  operator_delete(in_RDI);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, issue164) {
  // This is interpretted as a string value followed by a colon.
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " \"property\" : \"value\" }";
  {
  b.settings_["failIfExtra"] = false;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs == "");
  JSONTEST_ASSERT_EQUAL("property", root);
  delete reader;
  }
  {
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(errs,
      "* Line 1, Column 13\n"
      "  Extra non-whitespace after JSON value.\n");
  JSONTEST_ASSERT_EQUAL("property", root);
  delete reader;
  }
  {
  b.settings_["failIfExtra"] = false;
  b.strictMode(&b.settings_);
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(errs,
      "* Line 1, Column 13\n"
      "  Extra non-whitespace after JSON value.\n");
  JSONTEST_ASSERT_EQUAL("property", root);
  delete reader;
  }
}